

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

VectorSet * __thiscall
TreeIncPruneBGPlanner::CrossSumNode
          (VectorSet *__return_storage_ptr__,TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  pointer pvVar1;
  bool bVar2;
  reference pvVar3;
  VectorSet *A;
  uint uVar4;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> as;
  VectorSet G1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> os;
  VectorSet local_58;
  
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_cs_nodes_at_level,(ulong)depth);
  *pvVar3 = *pvVar3 + 1;
  this->_m_nodes_visited = this->_m_nodes_visited + 1;
  (__return_storage_ptr__->data_).size_ = 0;
  (__return_storage_ptr__->data_).data_ = (pointer)0x0;
  __return_storage_ptr__->size1_ = 0;
  __return_storage_ptr__->size2_ = 0;
  bVar2 = CheckCache_CrossSum(this,a,depth,jpol,__return_storage_ptr__);
  if (!bVar2) {
    GetObservationsFromDepth(&os,this,depth);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&as,((long)(jpol->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(jpol->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&G1);
    pvVar1 = (jpol->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar4 = 0; uVar5 = (ulong)uVar4,
        (long)as.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)as.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != uVar5; uVar4 = uVar4 + 1) {
      as.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] =
           *(uint *)(*(long *)&pvVar1[uVar5].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data +
                    (ulong)os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5] * 4);
    }
    A = GetGaoa(this,a,&os,&as);
    UnionNode(&local_58,this,a,depth + 1,jpol);
    AlphaVectorPlanning::CrossSum(&G1,(AlphaVectorPlanning *)this,A,&local_58);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::operator=(__return_storage_ptr__,&G1);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&G1.data_);
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&local_58.data_);
    if (this->_m_pruneAfterCrossSum == true) {
      AlphaVectorPlanning::Prune(&G1,(AlphaVectorPlanning *)this,__return_storage_ptr__);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator=(__return_storage_ptr__,&G1);
      boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                (&G1.data_);
    }
    AddToCache_CrossSum(this,a,depth,jpol,__return_storage_ptr__);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&as.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet
TreeIncPruneBGPlanner::CrossSumNode(Index a,
                                    Index depth,
                                    const vector<vector<Index> > &jpol)
{
    _m_cs_nodes_at_level.at(depth)++;
    _m_nodes_visited++;

    VectorSet G;
    if(CheckCache_CrossSum(a,depth,jpol,G))
    {
        // G has now been filled by the cache
    }
    else
    {
        vector<Index> os=GetObservationsFromDepth(depth);

#if DEBUG_TreeIncPruneBGPlannerVerbose
        cout << "CrossSumNode: a=" << a << ",d=" << depth << "(obs="
             << SoftPrintVector(os) << "),jpol="
             << SoftPrintJpol(jpol) << endl;
#endif

        // figure out which a,o,aPrime we need to get
        
        vector<Index> as(jpol.size());
        for(Index k=0;k!=as.size();++k)
            as[k]=jpol[k][os[k]];
        VectorSet *Gaoa=GetGaoa(a,os,as);

        G=CrossSum(*Gaoa,
                   UnionNode(a,
                             depth+1, // we up the depth
                             jpol));
        if(_m_pruneAfterCrossSum)
            G=PruneAfterCrossSum(depth, G);
        AddToCache_CrossSum(a, depth, jpol, G);
    }

    return(G);
}